

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O0

bool __thiscall
google::protobuf::util::anon_unknown_5::UnknownFieldOrdering::operator()
          (UnknownFieldOrdering *this,IndexUnknownFieldPair *a,IndexUnknownFieldPair *b)

{
  int iVar1;
  int iVar2;
  Type TVar3;
  Type TVar4;
  IndexUnknownFieldPair *b_local;
  IndexUnknownFieldPair *a_local;
  UnknownFieldOrdering *this_local;
  
  iVar1 = UnknownField::number(a->second);
  iVar2 = UnknownField::number(b->second);
  if (iVar1 < iVar2) {
    this_local._7_1_ = true;
  }
  else {
    iVar1 = UnknownField::number(a->second);
    iVar2 = UnknownField::number(b->second);
    if (iVar2 < iVar1) {
      this_local._7_1_ = false;
    }
    else {
      TVar3 = UnknownField::type(a->second);
      TVar4 = UnknownField::type(b->second);
      this_local._7_1_ = (int)TVar3 < (int)TVar4;
    }
  }
  return this_local._7_1_;
}

Assistant:

inline bool operator()(const IndexUnknownFieldPair& a,
                         const IndexUnknownFieldPair& b) const {
    if (a.second->number() < b.second->number()) return true;
    if (a.second->number() > b.second->number()) return false;
    return a.second->type() < b.second->type();
  }